

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpge.cpp
# Opt level: O0

bool jpge::compress_image_to_jpeg_file
               (char *pFilename,int width,int height,int num_channels,uint8 *pImage_data,
               params *comp_params)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int in_EDX;
  int __oflag;
  cfile_stream *ctx;
  char *in_RDI;
  uint8 *pBuf;
  int i;
  uint pass_index;
  jpeg_encoder dst_image;
  cfile_stream dst_stream;
  undefined1 in_stack_ffffffffffffcac0;
  byte in_stack_ffffffffffffcac1;
  undefined1 in_stack_ffffffffffffcac2;
  undefined1 in_stack_ffffffffffffcac3;
  uint in_stack_ffffffffffffcac4;
  undefined4 in_stack_ffffffffffffcacc;
  undefined4 uVar4;
  int local_3518;
  uint local_3514;
  jpeg_encoder local_3510;
  undefined4 local_58;
  cfile_stream local_48 [2];
  int local_18;
  char *local_10;
  byte local_1;
  
  local_18 = in_EDX;
  local_10 = in_RDI;
  cfile_stream::cfile_stream
            ((cfile_stream *)
             CONCAT44(in_stack_ffffffffffffcac4,
                      CONCAT13(in_stack_ffffffffffffcac3,
                               CONCAT12(in_stack_ffffffffffffcac2,
                                        CONCAT11(in_stack_ffffffffffffcac1,in_stack_ffffffffffffcac0
                                                )))));
  uVar1 = cfile_stream::open(local_48,local_10,__oflag);
  if ((uVar1 & 1) == 0) {
    local_1 = 0;
    local_58 = 1;
  }
  else {
    jpeg_encoder::jpeg_encoder
              ((jpeg_encoder *)
               CONCAT44(in_stack_ffffffffffffcac4,
                        CONCAT13(in_stack_ffffffffffffcac3,
                                 CONCAT12(in_stack_ffffffffffffcac2,
                                          CONCAT11(in_stack_ffffffffffffcac1,
                                                   in_stack_ffffffffffffcac0)))));
    ctx = local_48;
    uVar1 = jpeg_encoder::init(&local_3510,(EVP_PKEY_CTX *)ctx);
    uVar4 = CONCAT13((char)uVar1,(int3)in_stack_ffffffffffffcacc);
    if ((uVar1 & 1) == 0) {
      local_1 = 0;
    }
    else {
      local_3514 = 0;
      while( true ) {
        iVar3 = (int)ctx;
        in_stack_ffffffffffffcac4 = local_3514;
        uVar2 = jpeg_encoder::get_total_passes(&local_3510);
        if (uVar2 <= in_stack_ffffffffffffcac4) break;
        for (local_3518 = 0; local_3518 < local_18; local_3518 = local_3518 + 1) {
          in_stack_ffffffffffffcac3 =
               jpeg_encoder::process_scanline
                         ((jpeg_encoder *)CONCAT44(uVar4,uVar2),
                          (void *)CONCAT44(in_stack_ffffffffffffcac4,
                                           CONCAT13(in_stack_ffffffffffffcac3,
                                                    CONCAT12(in_stack_ffffffffffffcac2,
                                                             CONCAT11(in_stack_ffffffffffffcac1,
                                                                      in_stack_ffffffffffffcac0)))))
          ;
          if (!(bool)in_stack_ffffffffffffcac3) {
            local_1 = 0;
            goto LAB_00151202;
          }
        }
        ctx = (cfile_stream *)0x0;
        in_stack_ffffffffffffcac2 =
             jpeg_encoder::process_scanline
                       ((jpeg_encoder *)CONCAT44(uVar4,uVar2),
                        (void *)CONCAT44(in_stack_ffffffffffffcac4,
                                         CONCAT13(in_stack_ffffffffffffcac3,
                                                  CONCAT12(in_stack_ffffffffffffcac2,
                                                           CONCAT11(in_stack_ffffffffffffcac1,
                                                                    in_stack_ffffffffffffcac0)))));
        if (!(bool)in_stack_ffffffffffffcac2) {
          local_1 = 0;
          goto LAB_00151202;
        }
        local_3514 = local_3514 + 1;
      }
      jpeg_encoder::deinit
                ((jpeg_encoder *)
                 CONCAT44(in_stack_ffffffffffffcac4,
                          CONCAT13(in_stack_ffffffffffffcac3,
                                   CONCAT12(in_stack_ffffffffffffcac2,
                                            CONCAT11(in_stack_ffffffffffffcac1,
                                                     in_stack_ffffffffffffcac0)))));
      iVar3 = cfile_stream::close(local_48,iVar3);
      in_stack_ffffffffffffcac1 = (byte)iVar3;
      local_1 = in_stack_ffffffffffffcac1 & 1;
    }
LAB_00151202:
    local_58 = 1;
    jpeg_encoder::~jpeg_encoder((jpeg_encoder *)0x15120c);
  }
  cfile_stream::~cfile_stream
            ((cfile_stream *)
             CONCAT44(in_stack_ffffffffffffcac4,
                      CONCAT13(in_stack_ffffffffffffcac3,
                               CONCAT12(in_stack_ffffffffffffcac2,
                                        CONCAT11(in_stack_ffffffffffffcac1,in_stack_ffffffffffffcac0
                                                )))));
  return (bool)(local_1 & 1);
}

Assistant:

bool compress_image_to_jpeg_file(const char* pFilename, int width, int height, int num_channels, const uint8* pImage_data, const params& comp_params) {
  cfile_stream dst_stream;
  if (!dst_stream.open(pFilename))
    return false;

  jpge::jpeg_encoder dst_image;
  if (!dst_image.init(&dst_stream, width, height, num_channels, comp_params))
    return false;

  for (uint pass_index = 0; pass_index < dst_image.get_total_passes(); pass_index++) {
    for (int i = 0; i < height; i++) {
      const uint8* pBuf = pImage_data + i * width * num_channels;
      if (!dst_image.process_scanline(pBuf))
        return false;
    }
    if (!dst_image.process_scanline(NULL))
      return false;
  }

  dst_image.deinit();

  return dst_stream.close();
}